

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O0

UGroup * re2::MaybeParsePerlCCEscape(StringPiece *s,ParseFlags parse_flags)

{
  ParseFlags PVar1;
  size_type sVar2;
  const_reference pcVar3;
  const_pointer str;
  UGroup *pUVar4;
  UGroup *g;
  StringPiece name;
  ParseFlags parse_flags_local;
  StringPiece *s_local;
  
  name.size_._4_4_ = parse_flags;
  PVar1 = operator&(parse_flags,PerlClasses);
  if (((PVar1 != NoParseFlags) && (sVar2 = StringPiece::size(s), 1 < sVar2)) &&
     (pcVar3 = StringPiece::operator[](s,0), *pcVar3 == '\\')) {
    str = StringPiece::data(s);
    StringPiece::StringPiece((StringPiece *)&g,str,2);
    pUVar4 = LookupPerlGroup((StringPiece *)&g);
    if (pUVar4 != (UGroup *)0x0) {
      sVar2 = StringPiece::size((StringPiece *)&g);
      StringPiece::remove_prefix(s,sVar2);
      return pUVar4;
    }
    return (UGroup *)0x0;
  }
  return (UGroup *)0x0;
}

Assistant:

const UGroup* MaybeParsePerlCCEscape(StringPiece* s, Regexp::ParseFlags parse_flags) {
  if (!(parse_flags & Regexp::PerlClasses))
    return NULL;
  if (s->size() < 2 || (*s)[0] != '\\')
    return NULL;
  // Could use StringPieceToRune, but there aren't
  // any non-ASCII Perl group names.
  StringPiece name(s->data(), 2);
  const UGroup *g = LookupPerlGroup(name);
  if (g == NULL)
    return NULL;
  s->remove_prefix(name.size());
  return g;
}